

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O2

ostream * ser::operator<<(ostream *out,Savepoint *sp)

{
  ostream *poVar1;
  string local_30;
  
  Savepoint::ToString_abi_cxx11_(&local_30,sp);
  poVar1 = std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, const Savepoint& sp)
    {
        return out << sp.ToString();
    }